

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O3

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          error_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  undefined8 *puVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::__cxx11::string::reserve((ulong)&local_38);
  std::__cxx11::string::
  _M_replace_dispatch<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
            ((string *)&local_38,local_38 + local_30);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ +
           0x10);
  *(undefined8 **)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ =
       puVar1;
  if (local_38 == &local_28) {
    *puVar1 = CONCAT71(uStack_27,local_28);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ + 0x18) =
         uStack_20;
  }
  else {
    *(undefined1 **)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ =
         local_38;
    *(ulong *)((long)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_
              + 0x10) = CONCAT71(uStack_27,local_28);
  }
  *(long *)((long)&(__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_ + 8
           ) = local_30;
  __return_storage_ptr__->which_ = 2;
  return __return_storage_ptr__;
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::error_t<Iterator> &value) const {
        extracts::error_t r;
        auto size = std::distance(value.string.from, value.string.to);
        r.str.reserve(size);
        r.str.append(value.string.from, value.string.to);
        return r;
    }